

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O0

vector_t *** gauden_alloc_param(uint32 n_cb,uint32 n_feat,uint32 n_density,uint32 *veclen)

{
  vector_t ***ppppfVar1;
  void *pvVar2;
  uint local_48;
  uint local_44;
  uint32 l;
  uint32 k;
  uint32 j;
  uint32 i;
  float32 *buf;
  vector_t ***param;
  uint32 blksize;
  uint32 *veclen_local;
  uint32 n_density_local;
  uint32 n_feat_local;
  uint32 n_cb_local;
  
  param._4_4_ = 0;
  for (l = 0; l < n_feat; l = l + 1) {
    param._4_4_ = veclen[l] + param._4_4_;
  }
  ppppfVar1 = (vector_t ***)
              __ckd_calloc_3d__((ulong)n_cb,(ulong)n_feat,(ulong)n_density,8,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                                ,0xd1);
  pvVar2 = __ckd_calloc__((ulong)(n_cb * n_density * param._4_4_),4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                          ,0xd4);
  local_48 = 0;
  for (k = 0; k < n_cb; k = k + 1) {
    for (l = 0; l < n_feat; l = l + 1) {
      for (local_44 = 0; local_44 < n_density; local_44 = local_44 + 1) {
        ppppfVar1[k][l][local_44] = (vector_t)((long)pvVar2 + (ulong)local_48 * 4);
        local_48 = veclen[l] + local_48;
      }
    }
  }
  return ppppfVar1;
}

Assistant:

vector_t ***
gauden_alloc_param(uint32 n_cb,
		   uint32 n_feat,
		   uint32 n_density,
		   const uint32 *veclen)
{
    uint32 blksize;
    vector_t ***param;
    float32 *buf;
    uint32 i, j, k, l;

    for (blksize = 0, j = 0; j < n_feat; j++)
	blksize += veclen[j];

    param = (vector_t ***) ckd_calloc_3d(n_cb, n_feat, n_density,
					 sizeof(vector_t));
    
    buf = ckd_calloc(n_cb * n_density * blksize,
		     sizeof(float32));

    for (i = 0, l = 0; i < n_cb; i++) {
	for (j = 0; j < n_feat; j++) {
	    for (k = 0; k < n_density; k++) {
		param[i][j][k] = &buf[l];

		l += veclen[j];
	    }
	}
    }
    
    return param;
}